

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

bool __thiscall
JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::operator+=
          (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *this,
          HalfCycles rhs)

{
  bool bVar1;
  HalfCycles local_48;
  WrappedInt<HalfCycles> local_40;
  HalfCycles local_38;
  HalfCycles local_30;
  WrappedInt<HalfCycles> local_28;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *local_20;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *this_local;
  HalfCycles rhs_local;
  
  local_20 = this;
  this_local = (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *)
               rhs.super_WrappedInt<HalfCycles>.length_;
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_update_).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
  this->is_flushed_ = false;
  HalfCycles::HalfCycles(&local_30,1);
  local_28.length_ =
       (IntType)WrappedInt<HalfCycles>::operator*((WrappedInt<HalfCycles> *)&this_local,&local_30);
  WrappedInt<HalfCycles>::operator-=
            (&(this->time_until_event_).super_WrappedInt<HalfCycles>,(HalfCycles *)&local_28);
  HalfCycles::HalfCycles(&local_38,0);
  bVar1 = WrappedInt<HalfCycles>::operator<=
                    (&(this->time_until_event_).super_WrappedInt<HalfCycles>,&local_38);
  if (bVar1) {
    HalfCycles::HalfCycles(&local_48,1);
    local_40.length_ =
         (IntType)WrappedInt<HalfCycles>::operator/
                            (&(this->time_until_event_).super_WrappedInt<HalfCycles>,&local_48);
    (this->time_overrun_).super_WrappedInt<HalfCycles>.length_ = local_40.length_;
    flush(this);
    update_sequence_point(this);
  }
  return bVar1;
}

Assistant:

forceinline bool operator += (LocalTimeScale rhs) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				if(clocking_preference_ == ClockingHint::Preference::None) {
					return false;
				}
			}

			if constexpr (multiplier != 1) {
				time_since_update_ += rhs * multiplier;
			} else {
				time_since_update_ += rhs;
			}
			is_flushed_ = false;

			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				if (clocking_preference_ == ClockingHint::Preference::RealTime) {
					flush();
					return true;
				}
			}

			if constexpr (has_sequence_points<T>::value) {
				time_until_event_ -= rhs * multiplier;
				if(time_until_event_ <= LocalTimeScale(0)) {
					time_overrun_ = time_until_event_ / divider;
					flush();
					update_sequence_point();
					return true;
				}
			}

			return false;
		}